

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadImportSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  Type TVar3;
  Index IVar4;
  size_t sVar5;
  undefined4 uVar6;
  undefined1 *in_stack_fffffffffffffe18;
  undefined4 uVar7;
  Index local_19c;
  Type TStack_198;
  Index sig_index_1;
  Type local_190;
  size_t local_188;
  size_t local_180;
  size_t local_178;
  Enum local_16c;
  Enum local_168;
  bool local_161;
  Type TStack_160;
  bool mutable_;
  Type type;
  undefined1 local_130 [8];
  Limits page_limits;
  undefined1 local_e8 [8];
  Limits elem_limits;
  Type elem_type;
  Index local_9c;
  Type TStack_98;
  Index sig_index;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  Enum local_78;
  Enum local_74;
  byte local_6d;
  Enum local_6c;
  undefined1 auStack_68 [3];
  uint8_t kind;
  string_view field_name;
  undefined1 local_50 [8];
  string_view module_name;
  Index i;
  uint local_30;
  Enum local_2c;
  Index num_imports;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _num_imports = section_size;
  section_size_local = (Offset)this;
  local_2c = (*this->delegate_->_vptr_BinaryReaderDelegate[0xf])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_2c);
  if (bVar1) {
    RVar2 = ReadCount(this,&local_30,"import count");
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x10])();
      bVar1 = Succeeded(RVar2);
      if (bVar1) {
        for (module_name._M_str._4_4_ = 0; module_name._M_str._4_4_ < local_30;
            module_name._M_str._4_4_ = module_name._M_str._4_4_ + 1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
          field_name._M_str._4_4_ = ReadStr(this,(string_view *)local_50,"import module name");
          bVar1 = Failed(field_name._M_str._4_4_);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_68);
          local_6c = (Enum)ReadStr(this,(string_view *)auStack_68,"import field name");
          bVar1 = Failed((Result)local_6c);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          local_74 = (Enum)ReadU8(this,&local_6d,"import kind");
          bVar1 = Failed((Result)local_74);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          local_88 = (size_t)local_50;
          local_80 = module_name._M_len;
          TStack_98 = _auStack_68;
          local_90 = field_name._M_len;
          TVar3 = _auStack_68;
          sVar5 = field_name._M_len;
          local_78 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x11])
                               (this->delegate_,(ulong)module_name._M_str._4_4_,(ulong)local_6d,
                                local_50,module_name._M_len,field_name._M_len,_auStack_68,
                                field_name._M_len);
          uVar6 = (undefined4)(sVar5 >> 0x20);
          IVar4 = TVar3.type_index_;
          bVar1 = Succeeded((Result)local_78);
          uVar7 = (undefined4)((ulong)in_stack_fffffffffffffe18 >> 0x20);
          if (!bVar1) {
            PrintError(this,"OnImport callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          switch(local_6d) {
          case 0:
            RVar2 = ReadIndex(this,&local_9c,"import signature index");
            bVar1 = Failed(RVar2);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x12])
                                    (this->delegate_,(ulong)module_name._M_str._4_4_,local_50,
                                     module_name._M_len,_auStack_68,field_name._M_len,
                                     CONCAT44(IVar4,this->num_func_imports_),
                                     CONCAT44(uVar6,local_9c));
            bVar1 = Succeeded(RVar2);
            if (!bVar1) {
              PrintError(this,"OnImportFunc callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            this->num_func_imports_ = this->num_func_imports_ + 1;
            break;
          case 1:
            Limits::Limits((Limits *)local_e8);
            RVar2 = ReadTable(this,(Type *)&elem_limits.has_max,(Limits *)local_e8);
            bVar1 = Failed(RVar2);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            page_limits.has_max = elem_limits.has_max;
            page_limits.is_shared = elem_limits.is_shared;
            page_limits.is_64 = elem_limits.is_64;
            page_limits._19_5_ = elem_limits._19_5_;
            in_stack_fffffffffffffe18 = local_e8;
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x13])
                                    (this->delegate_,(ulong)module_name._M_str._4_4_,local_50,
                                     module_name._M_len,_auStack_68,field_name._M_len,
                                     CONCAT44(IVar4,this->num_table_imports_),elem_limits._16_8_,
                                     in_stack_fffffffffffffe18);
            bVar1 = Succeeded(RVar2);
            if (!bVar1) {
              PrintError(this,"OnImportTable callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            this->num_table_imports_ = this->num_table_imports_ + 1;
            break;
          case 2:
            Limits::Limits((Limits *)local_130);
            RVar2 = ReadMemory(this,(Limits *)local_130);
            bVar1 = Failed(RVar2);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            type = _auStack_68;
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x14])
                                    (this->delegate_,(ulong)module_name._M_str._4_4_,local_50,
                                     module_name._M_len,_auStack_68,field_name._M_len,
                                     CONCAT44(IVar4,this->num_memory_imports_),local_130);
            bVar1 = Succeeded(RVar2);
            if (!bVar1) {
              PrintError(this,"OnImportMemory callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            this->num_memory_imports_ = this->num_memory_imports_ + 1;
            break;
          case 3:
            local_168 = (Enum)ReadGlobalHeader(this,&stack0xfffffffffffffea0,&local_161);
            bVar1 = Failed((Result)local_168);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            local_180 = (size_t)local_50;
            local_178 = module_name._M_len;
            local_190 = _auStack_68;
            local_188 = field_name._M_len;
            TStack_198 = TStack_160;
            in_stack_fffffffffffffe18 = (undefined1 *)CONCAT44(uVar7,(uint)(local_161 & 1));
            local_16c = (*this->delegate_->_vptr_BinaryReaderDelegate[0x15])
                                  (this->delegate_,(ulong)module_name._M_str._4_4_,local_50,
                                   module_name._M_len,_auStack_68,field_name._M_len,
                                   CONCAT44(IVar4,this->num_global_imports_),TStack_160,
                                   in_stack_fffffffffffffe18);
            bVar1 = Succeeded((Result)local_16c);
            if (!bVar1) {
              PrintError(this,"OnImportGlobal callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            this->num_global_imports_ = this->num_global_imports_ + 1;
            break;
          case 4:
            bVar1 = Features::exceptions_enabled(&this->options_->features);
            if (!bVar1) {
              PrintError(this,"invalid import tag kind: exceptions not allowed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar2 = ReadTagType(this,&local_19c);
            bVar1 = Failed(RVar2);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x16])
                                    (this->delegate_,(ulong)module_name._M_str._4_4_,local_50,
                                     module_name._M_len,_auStack_68,field_name._M_len,
                                     CONCAT44(IVar4,this->num_tag_imports_),
                                     CONCAT44(uVar6,local_19c));
            bVar1 = Succeeded(RVar2);
            if (!bVar1) {
              PrintError(this,"OnImportTag callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            this->num_tag_imports_ = this->num_tag_imports_ + 1;
            break;
          default:
            PrintError(this,"malformed import kind: %d",(ulong)local_6d);
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x17])();
        bVar1 = Succeeded(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndImportSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnImportCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginImportSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadImportSection(Offset section_size) {
  CALLBACK(BeginImportSection, section_size);
  Index num_imports;
  CHECK_RESULT(ReadCount(&num_imports, "import count"));
  CALLBACK(OnImportCount, num_imports);
  for (Index i = 0; i < num_imports; ++i) {
    std::string_view module_name;
    CHECK_RESULT(ReadStr(&module_name, "import module name"));
    std::string_view field_name;
    CHECK_RESULT(ReadStr(&field_name, "import field name"));

    uint8_t kind;
    CHECK_RESULT(ReadU8(&kind, "import kind"));
    CALLBACK(OnImport, i, static_cast<ExternalKind>(kind), module_name,
             field_name);
    switch (static_cast<ExternalKind>(kind)) {
      case ExternalKind::Func: {
        Index sig_index;
        CHECK_RESULT(ReadIndex(&sig_index, "import signature index"));
        CALLBACK(OnImportFunc, i, module_name, field_name, num_func_imports_,
                 sig_index);
        num_func_imports_++;
        break;
      }

      case ExternalKind::Table: {
        Type elem_type;
        Limits elem_limits;
        CHECK_RESULT(ReadTable(&elem_type, &elem_limits));
        CALLBACK(OnImportTable, i, module_name, field_name, num_table_imports_,
                 elem_type, &elem_limits);
        num_table_imports_++;
        break;
      }

      case ExternalKind::Memory: {
        Limits page_limits;
        CHECK_RESULT(ReadMemory(&page_limits));
        CALLBACK(OnImportMemory, i, module_name, field_name,
                 num_memory_imports_, &page_limits);
        num_memory_imports_++;
        break;
      }

      case ExternalKind::Global: {
        Type type;
        bool mutable_;
        CHECK_RESULT(ReadGlobalHeader(&type, &mutable_));
        CALLBACK(OnImportGlobal, i, module_name, field_name,
                 num_global_imports_, type, mutable_);
        num_global_imports_++;
        break;
      }

      case ExternalKind::Tag: {
        ERROR_UNLESS(options_.features.exceptions_enabled(),
                     "invalid import tag kind: exceptions not allowed");
        Index sig_index;
        CHECK_RESULT(ReadTagType(&sig_index));
        CALLBACK(OnImportTag, i, module_name, field_name, num_tag_imports_,
                 sig_index);
        num_tag_imports_++;
        break;
      }

      default:
        PrintError("malformed import kind: %d", kind);
        return Result::Error;
    }
  }

  CALLBACK0(EndImportSection);
  return Result::Ok;
}